

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QWidgetList *
focusPath(QWidgetList *__return_storage_ptr__,QWidget *from,QWidget *to,FocusDirection direction)

{
  QWidget **ppQVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  qsizetype qVar7;
  QWidget **__old_val_1;
  iterator iVar8;
  QWidget **ppQVar9;
  long in_FS_OFFSET;
  QArrayData *d;
  QList<QWidget_*> local_58;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  iVar8.i = (QWidget **)QArrayData::allocate(&local_40,8,0x10,1,KeepSize);
  local_58.d.d = (Data *)local_40;
  *iVar8.i = from;
  local_58.d.size = 1;
  if (from == to) {
    local_58.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = (Data *)local_40;
    local_58.d.ptr = (QWidget **)0x0;
    (__return_storage_ptr__->d).ptr = iVar8.i;
    local_58.d.size = 0;
    (__return_storage_ptr__->d).size = 1;
  }
  else {
    local_58.d.ptr = iVar8.i;
    do {
      if (direction == Previous) {
        iVar8.i = (QWidget **)0x88;
LAB_00311f9f:
        from = *(QWidget **)
                (*(long *)(*(long *)(*(long *)&from->field_0x8 + 8) + 8) + (long)iVar8.i);
      }
      else if (direction == Next) {
        iVar8.i = (QWidget **)0x80;
        goto LAB_00311f9f;
      }
      if (local_58.d.size == 0) {
LAB_00311ff2:
        iVar8.i = (QWidget **)0xffffffffffffffff;
      }
      else {
        ppQVar9 = (QWidget **)0xfffffffffffffff8;
        do {
          ppQVar1 = ppQVar9 + -local_58.d.size;
          if (ppQVar1 == (QWidget **)0xfffffffffffffff8) goto LAB_00311fec;
          iVar8.i = ppQVar9 + 1;
          puVar2 = (undefined8 *)((long)(local_58.d.ptr + 1) + (long)ppQVar9);
          ppQVar9 = iVar8.i;
        } while ((QWidget *)*puVar2 != from);
        iVar8.i = iVar8.i >> 3;
LAB_00311fec:
        if (ppQVar1 == (QWidget **)0xfffffffffffffff8) goto LAB_00311ff2;
      }
      if (iVar8.i != (QWidget **)0xffffffffffffffff) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (QWidget **)0x0;
        (__return_storage_ptr__->d).size = 0;
        goto LAB_00312071;
      }
      local_40 = from;
      QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                ((QPodArrayOps<QWidget*> *)&local_58,local_58.d.size,&local_40);
      iVar8 = QList<QWidget_*>::end(&local_58);
      qVar7 = local_58.d.size;
    } while (from != to);
    uVar3 = local_58.d.d._0_4_;
    uVar4 = local_58.d.d._4_4_;
    uVar5 = local_58.d.ptr._0_4_;
    uVar6 = local_58.d.ptr._4_4_;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (QWidget **)0x0;
    *(undefined4 *)&(__return_storage_ptr__->d).d = uVar3;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar4;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar5;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar6;
    local_58.d.size = 0;
    (__return_storage_ptr__->d).size = qVar7;
  }
LAB_00312071:
  if ((QWidget *)local_58.d.d != (QWidget *)0x0) {
    LOCK();
    *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
    UNLOCK();
    if (*(int *)local_58.d.d == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetList focusPath(QWidget *from, QWidget *to, QWidgetPrivate::FocusDirection direction)
{
    QWidgetList path({from});
    if (from == to)
        return path;

    QWidget *current = from;
    do {
        switch (direction) {
        case QWidgetPrivate::FocusDirection::Previous:
            current = current->previousInFocusChain();
            break;
        case QWidgetPrivate::FocusDirection::Next:
            current = current->nextInFocusChain();
            break;
        }
        if (path.contains(current))
            return QWidgetList();
        path << current;
    } while (current != to);

    return path;
}